

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O1

lysc_type_leafref * lys_type_leafref_next(lysc_node *node,uint64_t *index)

{
  LY_DATA_TYPE LVar1;
  lysc_node *plVar2;
  void *pvVar3;
  lysc_node *plVar4;
  void *pvVar5;
  
  if ((node->nodetype & 0xc) == 0) {
    __assert_fail("node->nodetype & LYD_NODE_TERM",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                  ,0x440,
                  "struct lysc_type_leafref *lys_type_leafref_next(const struct lysc_node *, uint64_t *)"
                 );
  }
  plVar4 = node[1].parent;
  LVar1 = *(LY_DATA_TYPE *)&plVar4->next;
  if (LVar1 == LY_TYPE_UNION) {
    plVar2 = plVar4->prev;
    pvVar5 = (void *)*index;
    do {
      if (plVar2 == (lysc_node *)0x0) {
        pvVar3 = (void *)0x0;
      }
      else {
        pvVar3 = plVar2[-1].priv;
      }
      if (pvVar3 <= pvVar5) goto LAB_00144beb;
      plVar4 = *(lysc_node **)(plVar2->hash + (long)pvVar5 * 8 + -4);
      pvVar5 = (void *)((long)pvVar5 + 1);
      LVar1 = *(LY_DATA_TYPE *)&plVar4->next;
      *index = (uint64_t)pvVar5;
    } while (LVar1 != LY_TYPE_LEAFREF);
  }
  else if (*index == 0) {
    *index = 1;
    if (LVar1 != LY_TYPE_LEAFREF) {
      __assert_fail("leaf_type->basetype == LY_TYPE_LEAFREF",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                    ,0x454,
                    "struct lysc_type_leafref *lys_type_leafref_next(const struct lysc_node *, uint64_t *)"
                   );
    }
  }
  else {
LAB_00144beb:
    plVar4 = (lysc_node *)0x0;
  }
  return (lysc_type_leafref *)plVar4;
}

Assistant:

static struct lysc_type_leafref *
lys_type_leafref_next(const struct lysc_node *node, LY_ARRAY_COUNT_TYPE *index)
{
    struct lysc_type_leafref *ret = NULL;
    struct lysc_type_union *uni;
    struct lysc_type *leaf_type;

    assert(node->nodetype & LYD_NODE_TERM);

    leaf_type = ((struct lysc_node_leaf *)node)->type;
    if (leaf_type->basetype == LY_TYPE_UNION) {
        uni = (struct lysc_type_union *)leaf_type;

        /* find next union leafref */
        while (*index < LY_ARRAY_COUNT(uni->types)) {
            if (uni->types[*index]->basetype == LY_TYPE_LEAFREF) {
                ret = (struct lysc_type_leafref *)uni->types[*index];
                ++(*index);
                break;
            }

            ++(*index);
        }
    } else {
        /* return just the single leafref */
        if (*index == 0) {
            ++(*index);
            assert(leaf_type->basetype == LY_TYPE_LEAFREF);
            ret = (struct lysc_type_leafref *)leaf_type;
        }
    }

    return ret;
}